

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_strangle(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CClass *this;
  CHAR_DATA *ch_00;
  char *pcVar3;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  AFFECT_DATA af;
  int chance;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffdb58;
  CHAR_DATA *in_stack_ffffffffffffdb60;
  CHAR_DATA *in_stack_ffffffffffffdb68;
  undefined4 in_stack_ffffffffffffdb70;
  int in_stack_ffffffffffffdb74;
  undefined1 in_stack_ffffffffffffdb7b;
  int in_stack_ffffffffffffdb7c;
  int in_stack_ffffffffffffdb80;
  int in_stack_ffffffffffffdb84;
  undefined4 in_stack_ffffffffffffdb88;
  int in_stack_ffffffffffffdb8c;
  undefined2 in_stack_ffffffffffffdb90;
  undefined2 uVar5;
  short sVar6;
  short sVar7;
  ulong local_2460 [2];
  undefined4 local_2450;
  int local_241c;
  int in_stack_ffffffffffffdc34;
  undefined1 in_stack_ffffffffffffdc3b;
  int in_stack_ffffffffffffdc3c;
  CHAR_DATA *in_stack_ffffffffffffdc40;
  int in_stack_ffffffffffffdc5c;
  CHAR_DATA *in_stack_ffffffffffffdc60;
  int in_stack_ffffffffffffdd84;
  CHAR_DATA *in_stack_ffffffffffffdd88;
  CHAR_DATA *in_stack_ffffffffffffdd90;
  int in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed5c;
  CHAR_DATA *in_stack_ffffffffffffed60;
  CHAR_DATA *in_stack_ffffffffffffed68;
  
  one_argument((char *)in_stack_ffffffffffffdb60,(char *)in_stack_ffffffffffffdb58);
  local_241c = get_skill(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc5c);
  if (local_241c != 0) {
    in_stack_ffffffffffffdb74 = (int)in_RDI->level;
    in_stack_ffffffffffffdb68 = (CHAR_DATA *)(skill_table + gsn_strangle);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70));
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffdb68->next_in_room + (long)iVar2 * 2) <=
        in_stack_ffffffffffffdb74) {
      ch_00 = get_char_room(in_stack_ffffffffffffed68,(char *)in_stack_ffffffffffffed60);
      if (ch_00 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                     in_stack_ffffffffffffdb68);
        return;
      }
      if (ch_00 == in_RDI) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                     in_stack_ffffffffffffdb68);
        return;
      }
      bVar1 = is_affected(ch_00,(int)gsn_strangle);
      if ((bVar1) && (bVar1 = is_awake(ch_00), !bVar1)) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                     in_stack_ffffffffffffdb68);
        return;
      }
      if (ch_00->position == 7) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                     in_stack_ffffffffffffdb68);
        return;
      }
      bVar1 = is_safe(in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
      if (bVar1) {
        return;
      }
      bVar1 = check_sidestep(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                             in_stack_ffffffffffffed5c,in_stack_ffffffffffffed58);
      if (bVar1) {
        return;
      }
      bVar1 = check_blade_barrier(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
      if (bVar1) {
        return;
      }
      update_pc_last_fight(in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58);
      bVar1 = is_affected(ch_00,(int)gsn_strangle);
      if (bVar1) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                     in_stack_ffffffffffffdb68);
        return;
      }
      init_affect((AFFECT_DATA *)0x5ec50e);
      uVar5 = 0;
      sVar7 = in_RDI->level;
      sVar6 = gsn_strangle;
      _Var4 = std::pow<int,int>(0,0x5ec55c);
      local_2460[0] = (long)_Var4 | local_2460[0];
      local_2450 = 1;
      local_241c = in_RDI->level * 2 + ch_00->level * -2 + local_241c / 2;
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT26(sVar7,CONCAT24(sVar6,CONCAT22(uVar5,in_stack_ffffffffffffdb90))
                                    ),in_stack_ffffffffffffdb8c);
      local_241c = (local_241c - iVar2 / 2) + 10;
      bVar1 = is_affected(ch_00,(int)gsn_cloak_form);
      if (bVar1) {
        local_241c = local_241c + 0x14;
      }
      if (0x4b < local_241c) {
        local_241c = 0x4b;
      }
      iVar2 = number_percent();
      if (iVar2 < 0x32) {
        in_stack_ffffffffffffdb60 = (CHAR_DATA *)&stack0xffffffffffffdbe8;
        pcVar3 = pers(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
        sprintf((char *)in_stack_ffffffffffffdb60,"Help! %s is trying to strangle me!",pcVar3);
      }
      else {
        in_stack_ffffffffffffdb58 = (CHAR_DATA *)&stack0xffffffffffffdbe8;
        pcVar3 = pers(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
        sprintf((char *)in_stack_ffffffffffffdb58,"Help! %s just tried to strangle me!",pcVar3);
      }
      iVar2 = number_percent();
      if (local_241c < iVar2) {
        zero_vector((long *)local_2460);
        local_2450 = 5;
        affect_to_char(in_stack_ffffffffffffdb60,(AFFECT_DATA *)in_stack_ffffffffffffdb58);
        damage_old((CHAR_DATA *)
                   CONCAT26(sVar7,CONCAT24(sVar6,CONCAT22(uVar5,in_stack_ffffffffffffdb90))),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),
                   in_stack_ffffffffffffdb84,in_stack_ffffffffffffdb80,in_stack_ffffffffffffdb7c,
                   (bool)in_stack_ffffffffffffdb7b);
        check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                      (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
        WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                   (int)((ulong)in_stack_ffffffffffffdb68 >> 0x20));
        bVar1 = is_npc(in_stack_ffffffffffffdb58);
        if ((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffdb58), !bVar1)) {
          do_myell((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                   (char *)in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
        }
        multi_hit(in_stack_ffffffffffffdd90,in_stack_ffffffffffffdd88,in_stack_ffffffffffffdd84);
        return;
      }
      act((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
          in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,0);
      act((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
          in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,0);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
                   in_stack_ffffffffffffdb68);
      iVar2 = (int)((ulong)in_stack_ffffffffffffdb68 >> 0x20);
      affect_to_char(in_stack_ffffffffffffdb60,(AFFECT_DATA *)in_stack_ffffffffffffdb58);
      ch_00->position = 4;
      check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                    (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
      WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),iVar2);
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb74,in_stack_ffffffffffffdb70),
               in_stack_ffffffffffffdb68);
  return;
}

Assistant:

void do_strangle(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	int chance;
	AFFECT_DATA af;

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_strangle);

	if (chance == 0
		|| ch->level < skill_table[gsn_strangle].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to strangle properly.\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Try using a piece of rope and a high tree branch maybe?\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_strangle) && !is_awake(victim))
	{
		send_to_char("They are already lying on the ground unconcious.\n\r", ch);
		return;
	}

	if (victim->position == POS_FIGHTING)
	{
		send_to_char("They are already lying on the ground unconcious.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_strangle, 95))
		return;

	if (check_blade_barrier(ch, victim))
		return;

	update_pc_last_fight(ch, victim);

	if (is_affected(victim, gsn_strangle))
	{
		send_to_char("They are guarding their necks too well right now.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_strangle;
	af.level = ch->level;
	af.duration = 2;
	af.modifier = 0;
	af.location = 0;

	SET_BIT(af.bitvector, AFF_SLEEP);

	af.aftype = AFT_SKILL;
	af.mod_name = MOD_CONC;

	chance /= 2;
	chance += (2 * ch->level - 2 * victim->level);
	chance -= get_curr_stat(victim, STAT_DEX) / 2;
	chance += 10;

	if (is_affected(victim, gsn_cloak_form))
		chance += 20;

	if (chance > 75)
		chance = 75;

	if (number_percent() < 50)
		sprintf(buf, "Help! %s is trying to strangle me!", pers(ch, victim));
	else
		sprintf(buf, "Help! %s just tried to strangle me!", pers(ch, victim));

	if (number_percent() > chance)
	{
		af.duration = 2;

		zero_vector(af.bitvector);

		af.aftype = AFT_INVIS;
		affect_to_char(victim, &af);

		damage_old(ch, victim, 0, gsn_strangle, DAM_BASH, true);
		check_improve(ch, gsn_strangle, false, 2);
		WAIT_STATE(ch, 12);

		if (!is_npc(ch) && !is_npc(victim))
			do_myell(victim, buf, ch);

		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	act("$n grabs hold of $N's neck and puts them to sleep.", ch, 0, victim, TO_NOTVICT);
	act("You grab hold of $N's neck and put them to sleep.", ch, 0, victim, TO_CHAR);
	send_to_char("Someone grabs hold of your neck and puts you to sleep.\n\r", victim);
	affect_to_char(victim, &af);

	victim->position = POS_SLEEPING;
	check_improve(ch, gsn_strangle, true, 2);
	WAIT_STATE(ch, 12);
}